

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,false,true,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar8 = 0;
  uVar12 = 0;
  lVar10 = 0;
  iVar3 = 0;
  do {
    if (uVar8 == count + 0x3f >> 6) {
      return iVar3;
    }
    if (puVar1 == (unsigned_long *)0x0) {
      uVar9 = uVar12 + 0x40;
      if (count <= uVar12 + 0x40) {
        uVar9 = count;
      }
LAB_01829e4f:
      lVar5 = uVar12 * 4 + 2;
      for (; uVar12 < uVar9; uVar12 = uVar12 + 1) {
        uVar6 = uVar12;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar6 = (ulong)sel->sel_vector[uVar12];
        }
        bVar4 = *(long *)((long)&ldata->lower + lVar5 * 4) ==
                *(long *)((long)&rdata->lower + lVar5 * 4);
        bVar2 = *(long *)((long)ldata + lVar5 * 4 + -8) == *(long *)((long)rdata + lVar5 * 4 + -8);
        true_sel->sel_vector[iVar3] = (sel_t)uVar6;
        iVar3 = iVar3 + (!bVar4 || !bVar2);
        false_sel->sel_vector[lVar10] = (sel_t)uVar6;
        lVar10 = lVar10 + (ulong)(bVar4 && bVar2);
        lVar5 = lVar5 + 4;
      }
    }
    else {
      uVar6 = puVar1[uVar8];
      uVar9 = uVar12 + 0x40;
      if (count <= uVar12 + 0x40) {
        uVar9 = count;
      }
      if (uVar6 == 0xffffffffffffffff) goto LAB_01829e4f;
      uVar11 = uVar12;
      if (uVar6 == 0) {
        for (; uVar12 = uVar9, uVar11 < uVar9; uVar11 = uVar11 + 1) {
          uVar12 = uVar11;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)sel->sel_vector[uVar11];
          }
          false_sel->sel_vector[lVar10] = (sel_t)uVar12;
          lVar10 = lVar10 + 1;
        }
      }
      else {
        lVar5 = uVar12 * 4 + 2;
        uVar11 = 0;
        for (; uVar12 < uVar9; uVar12 = uVar12 + 1) {
          uVar7 = uVar12;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)sel->sel_vector[uVar12];
          }
          if ((uVar6 >> (uVar11 & 0x3f) & 1) == 0) {
            bVar4 = false;
          }
          else {
            bVar4 = *(long *)((long)&ldata->lower + lVar5 * 4) !=
                    *(long *)((long)&rdata->lower + lVar5 * 4) ||
                    *(long *)((long)ldata + lVar5 * 4 + -8) !=
                    *(long *)((long)rdata + lVar5 * 4 + -8);
          }
          true_sel->sel_vector[iVar3] = (sel_t)uVar7;
          iVar3 = iVar3 + bVar4;
          false_sel->sel_vector[lVar10] = (sel_t)uVar7;
          lVar10 = lVar10 + (ulong)(bVar4 ^ 1);
          uVar11 = uVar11 + 1;
          lVar5 = lVar5 + 4;
        }
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}